

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<slang::IntervalMap<unsigned_long,std::monostate,3u>>::
emplaceRealloc<slang::IntervalMap<unsigned_long,std::monostate,3u>>
          (SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *this,pointer pos
          ,IntervalMap<unsigned_long,_std::monostate,_3U> *args)

{
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  iterator pIVar4;
  long lVar5;
  pointer pIVar6;
  iterator __result;
  iterator in_RSI;
  SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *in_RDI;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  IntervalMap<unsigned_long,_std::monostate,_3U> *in_stack_ffffffffffffff98;
  IntervalMap<unsigned_long,_std::monostate,_3U> *in_stack_ffffffffffffffa0;
  iterator __last;
  size_type in_stack_ffffffffffffffb0;
  
  sVar1 = in_RDI->len;
  sVar2 = SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::max_size
                    ((SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *)
                     0x84710b);
  if (sVar1 == sVar2) {
    detail::throwLengthError();
  }
  sVar3 = SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::calculateGrowth
                    (in_RDI,in_stack_ffffffffffffffb0);
  __last = in_RSI;
  pIVar4 = SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::begin(in_RDI);
  lVar5 = (long)__last - (long)pIVar4;
  pIVar6 = (pointer)operator_new(0x84716a);
  IntervalMap<unsigned_long,_std::monostate,_3U>::IntervalMap
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  pIVar4 = SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::end(in_RDI);
  if (in_RSI == pIVar4) {
    __result = SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::begin
                         (in_RDI);
    pIVar4 = SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::end(in_RDI);
    std::
    uninitialized_move<slang::IntervalMap<unsigned_long,std::monostate,3u>*,slang::IntervalMap<unsigned_long,std::monostate,3u>*>
              (in_RSI,__last,__result);
  }
  else {
    SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::begin(in_RDI);
    std::
    uninitialized_move<slang::IntervalMap<unsigned_long,std::monostate,3u>*,slang::IntervalMap<unsigned_long,std::monostate,3u>*>
              (in_RSI,__last,in_stack_ffffffffffffffa0);
    pIVar4 = SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::end(in_RDI);
    std::
    uninitialized_move<slang::IntervalMap<unsigned_long,std::monostate,3u>*,slang::IntervalMap<unsigned_long,std::monostate,3u>*>
              (in_RSI,__last,in_stack_ffffffffffffffa0);
  }
  SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::cleanup
            (in_RDI,(EVP_PKEY_CTX *)pIVar4);
  in_RDI->len = in_RDI->len + 1;
  in_RDI->cap = sVar3;
  in_RDI->data_ = pIVar6;
  return pIVar6 + (lVar5 >> 6);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}